

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O3

bool __thiscall
optimization::common_expr_del::BlockNodes::query_node
          (BlockNodes *this,Op op,
          vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *operands)

{
  _List_node_base *p_Var1;
  const_iterator cVar2;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDX;
  Node node;
  _Move_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
  in_stack_fffffffffffffec8;
  Node local_120;
  
  std::
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&stack0xfffffffffffffec8,in_RDX);
  Node::Node(&local_120,
             (Op)in_stack_fffffffffffffec8.
                 super__Copy_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                 .
                 super__Move_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                 .
                 super__Copy_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                 .
                 super__Variant_storage_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
             ,operands);
  std::
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&stack0xfffffffffffffec8);
  cVar2 = std::
          _Rb_tree<optimization::common_expr_del::Node,_std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>,_std::_Select1st<std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>_>,_std::less<optimization::common_expr_del::Node>,_std::allocator<std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>_>_>
          ::find(&(this->node_map)._M_t,&local_120);
  std::__detail::__variant::
  _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_120.refVal);
  std::
  _Rb_tree<optimization::common_expr_del::NodeId,_optimization::common_expr_del::NodeId,_std::_Identity<optimization::common_expr_del::NodeId>,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
  ::~_Rb_tree(&local_120.parents._M_t);
  while (local_120.local_vars.super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
         _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_120.local_vars)
  {
    p_Var1 = (local_120.local_vars.
              super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl._M_node.
              super__List_node_base._M_next)->_M_next;
    operator_delete(local_120.local_vars.
                    super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                    _M_node.super__List_node_base._M_next,0x20);
    local_120.local_vars.super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
    _M_impl._M_node.super__List_node_base._M_next = p_Var1;
  }
  while (local_120.live_vars.super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
         _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_120.live_vars) {
    p_Var1 = (local_120.live_vars.
              super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl._M_node.
              super__List_node_base._M_next)->_M_next;
    operator_delete(local_120.live_vars.
                    super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                    _M_node.super__List_node_base._M_next,0x20);
    local_120.live_vars.super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
    _M_impl._M_node.super__List_node_base._M_next = p_Var1;
  }
  std::
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_120.operands);
  return (_Rb_tree_header *)cVar2._M_node != &(this->node_map)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool query_node(Op op, std::vector<Operand> operands) {
    Node node(op, operands);
    return node_map.count(node);
  }